

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O1

void __thiscall OpenMD::NPAT::evolveEtaB(NPAT *this)

{
  Mat3x3d *pMVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  uint j;
  long lVar4;
  
  pMVar1 = &this->prevEta_;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           pMVar1[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
      ;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pMVar1 = (Mat3x3d *)
             ((pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  uVar2 = (ulong)this->axis_;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar2 * 0x20) =
       (((this->super_NPT).targetPressure / -163882576.0 +
        *(double *)
         ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                super_RectMatrix<double,_3U,_3U>.data_ + uVar2 * 0x20)) *
       (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
       (this->super_NPT).instaVol) / ((this->super_NPT).NkBT * (this->super_NPT).tb2) +
       *(double *)
        ((long)(this->oldEta_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        + uVar2 * 0x20);
  return;
}

Assistant:

void NPAT::evolveEtaB() {
    prevEta_          = eta;
    eta(axis_, axis_) = oldEta_(axis_, axis_) +
                        dt2 * instaVol *
                            (press(axis_, axis_) -
                             targetPressure / Constants::pressureConvert) /
                            (NkBT * tb2);
  }